

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_>_>
  _Var4;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest> *pPVar5;
  char *pcVar6;
  char *pcVar7;
  element_type *peVar8;
  _Alloc_hider _Var9;
  char *value_param;
  byte bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  long *plVar14;
  long *plVar15;
  undefined8 *puVar16;
  ostream *poVar17;
  size_t sVar18;
  const_iterator cVar19;
  int *piVar20;
  undefined4 extraout_var;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer psVar21;
  pointer pIVar22;
  long lVar23;
  uint uVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar25;
  bool bVar26;
  string param_name;
  string test_suite_name;
  ParamGenerator<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_> generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_318;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest> *local_310;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  char *local_300;
  element_type *local_2f8;
  string local_2f0;
  size_t local_2d0;
  char *local_2c8;
  undefined8 local_2c0;
  char local_2b8 [16];
  long *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  pointer local_298;
  pointer local_290;
  ParamNameGeneratorFunc *local_288;
  char *local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  CodeLocation local_248;
  char *local_220;
  char local_210 [16];
  string local_200;
  CodeLocation local_1e0;
  undefined1 local_1b8 [16];
  _func_int_int_ptr_int *local_1a8;
  size_t local_1a0;
  ios_base local_138 [264];
  
  psVar21 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_310 = this;
  if (psVar21 !=
      (this->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar11 = false;
    do {
      local_2f8 = (psVar21->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      this_00 = (psVar21->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pIVar22 = (local_310->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_308 = this_00;
      local_298 = psVar21;
      if (pIVar22 !=
          (local_310->instantiations_).
          super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::InstantiationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          (*pIVar22->generator)(&local_2a8);
          local_288 = pIVar22->name_func;
          local_300 = pIVar22->file;
          iVar13 = pIVar22->line;
          local_2c8 = local_2b8;
          local_2c0 = 0;
          local_2b8[0] = '\0';
          sVar2 = (pIVar22->name)._M_string_length;
          if (sVar2 != 0) {
            local_1b8._0_8_ = &local_1a8;
            pcVar3 = (pIVar22->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)local_1b8,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)local_1b8);
            std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_1b8);
            if ((_func_int_int_ptr_int **)local_1b8._0_8_ != &local_1a8) {
              operator_delete((void *)local_1b8._0_8_);
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_2c8,(ulong)(local_2f8->test_suite_base_name)._M_dataplus._M_p);
          local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_278._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_278._M_impl.super__Rb_tree_header._M_header;
          local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_290 = pIVar22;
          local_278._M_impl.super__Rb_tree_header._M_header._M_right =
               local_278._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar14 = (long *)(**(code **)(*local_2a8 + 0x10))();
          local_2d0 = 0;
          while( true ) {
            plVar15 = (long *)(**(code **)(*local_2a8 + 0x18))();
            if (plVar14 == plVar15) {
              bVar10 = 0;
            }
            else {
              bVar10 = (**(code **)(*plVar14 + 0x30))(plVar14,plVar15);
              bVar10 = bVar10 ^ 1;
            }
            if (plVar15 != (long *)0x0) {
              (**(code **)(*plVar15 + 8))(plVar15);
            }
            if (bVar10 == 0) break;
            Message::Message((Message *)&local_318);
            puVar16 = (undefined8 *)(**(code **)(*plVar14 + 0x28))(plVar14);
            local_1a8 = (_func_int_int_ptr_int *)puVar16[2];
            local_1b8._0_8_ = *puVar16;
            local_1b8._8_8_ = puVar16[1];
            local_1a0 = local_2d0;
            (*local_288)(&local_2f0,
                         (TestParamInfo<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>
                          *)local_1b8);
            _Var9._M_p = local_2f0._M_dataplus._M_p;
            if (local_2f0._M_string_length == 0) {
              bVar11 = false;
            }
            else {
              lVar23 = local_2f0._M_string_length - 1;
              lVar25 = 0;
              do {
                uVar24 = (uint)(byte)_Var9._M_p[lVar25];
                iVar12 = isalnum(uVar24);
                bVar11 = iVar12 != 0 || uVar24 == 0x5f;
                if (iVar12 == 0 && uVar24 != 0x5f) break;
                bVar26 = lVar23 != lVar25;
                lVar25 = lVar25 + 1;
              } while (bVar26);
            }
            bVar11 = IsTrue(bVar11);
            peVar8 = local_2f8;
            pcVar6 = local_300;
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x246);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                         0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_2f0._M_dataplus._M_p,
                                   local_2f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\' is invalid, in ",0x11);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
              }
              else {
                sVar18 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar6,sVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," line ",6);
              plVar15 = (long *)std::ostream::operator<<(poVar17,iVar13);
              std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
              std::ostream::put((char)plVar15);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            cVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_278,&local_2f0);
            bVar11 = IsTrue((_Rb_tree_header *)cVar19._M_node ==
                            &local_278._M_impl.super__Rb_tree_header);
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x24a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_2f0._M_dataplus._M_p,
                                   local_2f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\', in ",6);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
              }
              else {
                sVar18 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar6,sVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," line ",6);
              plVar15 = (long *)std::ostream::operator<<(poVar17,iVar13);
              std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
              std::ostream::put((char)plVar15);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_278,&local_2f0);
            sVar2 = (peVar8->test_base_name)._M_string_length;
            if (sVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_318._M_head_impl + 0x10),
                         (peVar8->test_base_name)._M_dataplus._M_p,sVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_318._M_head_impl + 0x10),"/",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_318._M_head_impl + 0x10),local_2f0._M_dataplus._M_p,
                       local_2f0._M_string_length);
            pcVar6 = local_2c8;
            Message::GetString_abi_cxx11_(&local_200,(Message *)&local_318);
            local_280 = local_200._M_dataplus._M_p;
            piVar20 = (int *)(**(code **)(*plVar14 + 0x28))(plVar14);
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"satd_size: ",0xb);
            std::ostream::operator<<(&local_1a8,*piVar20);
            std::__cxx11::stringbuf::str();
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(local_138);
            value_param = local_220;
            local_248.file._M_dataplus._M_p = (pointer)&local_248.file.field_2;
            pcVar3 = (peVar8->code_location).file._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_248,pcVar3,
                       pcVar3 + (peVar8->code_location).file._M_string_length);
            local_248.line = (peVar8->code_location).line;
            iVar12 = (*(local_310->super_ParameterizedTestSuiteInfoBase).
                       _vptr_ParameterizedTestSuiteInfoBase[3])();
            bVar11 = IsTrue(true);
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x20e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                         ,0x6a);
              pcVar7 = local_300;
              if (local_300 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar18 = strlen(local_300);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,iVar13);
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            bVar11 = IsTrue(true);
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x223);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                         ,0x6f);
              pcVar7 = local_300;
              if (local_300 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar18 = strlen(local_300);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,iVar13);
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            _Var4.
            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_*,_false>
            ._M_head_impl =
                 (local_2f8->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_*,_false>
            ;
            (**(code **)(*plVar14 + 0x28))(plVar14);
            factory = (TestFactoryBase *)
                      (**(code **)(*(long *)_Var4.
                                            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_*,_false>
                                            ._M_head_impl + 0x10))
                                (_Var4.
                                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>_*,_false>
                                 ._M_head_impl);
            MakeAndRegisterTestInfo
                      (pcVar6,local_280,(char *)0x0,value_param,&local_248,
                       (TypeId)CONCAT44(extraout_var,iVar12),(SetUpTestSuiteFunc)0x0,
                       (TearDownTestSuiteFunc)0x0,factory);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248.file._M_dataplus._M_p != &local_248.file.field_2) {
              operator_delete(local_248.file._M_dataplus._M_p);
            }
            this_00 = local_308;
            if (local_220 != local_210) {
              operator_delete(local_220);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p);
            }
            if (local_318._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_318._M_head_impl + 8))();
            }
            (**(code **)(*plVar14 + 0x18))(plVar14);
            local_2d0 = local_2d0 + 1;
            bVar11 = true;
          }
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 8))(plVar14);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_278);
          if (local_2c8 != local_2b8) {
            operator_delete(local_2c8);
          }
          pIVar22 = local_290;
          if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
          }
          pIVar22 = pIVar22 + 1;
        } while (pIVar22 !=
                 (local_310->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar21 = local_298 + 1;
    } while (psVar21 !=
             (local_310->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar11) {
      return;
    }
  }
  pPVar5 = local_310;
  iVar13 = (*(local_310->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
             [2])(local_310);
  paVar1 = &local_1e0.file.field_2;
  pcVar3 = (pPVar5->code_location_).file._M_dataplus._M_p;
  local_1e0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + (pPVar5->code_location_).file._M_string_length);
  local_1e0.line = (pPVar5->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar13),&local_1e0,
             (pPVar5->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pPVar5->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SatdTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.file._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }